

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# csp_if_eth.c
# Opt level: O0

_Bool csp_if_eth_unpack_header
                (csp_eth_header_t *buf,uint32_t *packet_id,uint16_t *seg_size,
                uint16_t *packet_length)

{
  __uint16_t _Var1;
  __uint16_t *in_RCX;
  __uint16_t *in_RDX;
  undefined4 *in_RSI;
  long in_RDI;
  undefined1 local_1;
  
  if (in_RSI == (undefined4 *)0x0) {
    local_1 = false;
  }
  else if (in_RDX == (__uint16_t *)0x0) {
    local_1 = false;
  }
  else if (in_RCX == (__uint16_t *)0x0) {
    local_1 = false;
  }
  else {
    *in_RSI = CONCAT22(*(undefined2 *)(in_RDI + 0xe),*(undefined2 *)(in_RDI + 0x10));
    _Var1 = __bswap_16(*(__uint16_t *)(in_RDI + 0x12));
    *in_RDX = _Var1;
    _Var1 = __bswap_16(*(__uint16_t *)(in_RDI + 0x14));
    *in_RCX = _Var1;
    local_1 = true;
  }
  return local_1;
}

Assistant:

bool csp_if_eth_unpack_header(csp_eth_header_t * buf, 
                              uint32_t * packet_id,
                              uint16_t * seg_size, uint16_t * packet_length) {

    if (packet_id == NULL) return false;
    if (seg_size == NULL) return false;
    if (packet_length == NULL) return false;

    *packet_id = buf->packet_id << 16 | buf->src_addr;
    *seg_size = be16toh(buf->seg_size);
    *packet_length = be16toh(buf->packet_length);

    return true;
}